

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdKelvinStencilFunc::emulate_mthd(MthdKelvinStencilFunc *this)

{
  pgraph_state *state;
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((uVar1 & 0xfffffff8) == 0x200) {
    uVar3 = uVar1 & 7;
    uVar5 = 0;
  }
  else {
    uVar5 = 1;
    uVar3 = 0;
    if (uVar1 - 1 < 8) {
      iVar4 = pgraph_3d_class(state);
      if (iVar4 == 6) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.val - 1;
        uVar5 = 0;
      }
    }
  }
  _Var2 = pgraph_in_begin_end(state);
  err = uVar5 + 4;
  if (!_Var2) {
    err = uVar5;
  }
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  if (this->side == 0) {
    uVar5 = (uVar3 & 0xf) << 4 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a &
            0xffffff0f;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = uVar5;
    iVar4 = 0xd;
  }
  else {
    uVar5 = (uVar3 & 0xf) << 0x10 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_d &
            0xfff0ffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_d = uVar5;
    iVar4 = 0x10;
  }
  pgraph_bundle(state,iVar4,0,uVar5,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t rval = 0;
		uint32_t err = 0;
		if (val >= 0x200 && val < 0x208) {
			rval = val & 7;
		} else if (val > 0 && val <= 8 && pgraph_3d_class(&exp) == PGRAPH_3D_CURIE) {
			rval = val - 1;
		} else {
			err |= 1;
		}
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				if (side == 0) {
					insrt(exp.bundle_stencil_a, 4, 4, rval);
					pgraph_bundle(&exp, BUNDLE_STENCIL_A, 0, exp.bundle_stencil_a, true);
				} else {
					insrt(exp.bundle_stencil_d, 16, 4, rval);
					pgraph_bundle(&exp, BUNDLE_STENCIL_D, 0, exp.bundle_stencil_d, true);
				}
			}
		}
	}